

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cc
# Opt level: O0

void sptk::world::InitializeForwardRealFFT(int fft_size,ForwardRealFFT *forward_real_fft)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  void *pvVar4;
  int *in_RSI;
  int in_EDI;
  undefined1 auStackY_58 [20];
  uint in_stack_ffffffffffffffbc;
  fft_complex *in_stack_ffffffffffffffc0;
  double *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  
  *in_RSI = in_EDI;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)in_EDI;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RSI + 2) = pvVar4;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)in_EDI;
  uVar3 = SUB168(auVar2 * ZEXT816(0x10),0);
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar3);
  *(void **)(in_RSI + 4) = pvVar4;
  fft_plan_dft_r2c_1d(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                      in_stack_ffffffffffffffbc);
  memcpy(in_RSI + 6,auStackY_58,0x48);
  return;
}

Assistant:

void InitializeForwardRealFFT(int fft_size, ForwardRealFFT *forward_real_fft) {
  forward_real_fft->fft_size = fft_size;
  forward_real_fft->waveform = new double[fft_size];
  forward_real_fft->spectrum = new fft_complex[fft_size];
  forward_real_fft->forward_fft = fft_plan_dft_r2c_1d(fft_size,
      forward_real_fft->waveform, forward_real_fft->spectrum, FFT_ESTIMATE);
}